

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufWriteChar(xmlBufPtr buf,char *string)

{
  char *string_local;
  xmlBufPtr buf_local;
  
  if ((buf == (xmlBufPtr)0x0) || (buf->error != 0)) {
    buf_local._4_4_ = -1;
  }
  else {
    if ((buf->size != (ulong)buf->compat_size) && (buf->compat_size < 0x7fffffff)) {
      buf->size = (ulong)buf->compat_size;
    }
    if ((buf->use != (ulong)buf->compat_use) && (buf->compat_use < 0x7fffffff)) {
      buf->use = (ulong)buf->compat_use;
    }
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
      buf_local._4_4_ = -1;
    }
    else {
      buf_local._4_4_ = xmlBufCCat(buf,string);
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufWriteChar(xmlBufPtr buf, const char *string) {
    if ((buf == NULL) || (buf->error))
        return(-1);
    CHECK_COMPAT(buf)
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE)
        return(-1);
    return(xmlBufCCat(buf, string));
}